

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx2_blend_popcnt(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  auVar3 = _DAT_00117d60;
  auVar2 = _DAT_00117d40;
  if (len < 0x20) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = 2;
    do {
      uVar6 = uVar4;
      auVar8 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10),auVar2,
                                 *(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x10));
      auVar9 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x10),auVar3,
                                 *(undefined1 (*) [32])(array + uVar5 * 0x10));
      lVar7 = 0x20;
      do {
        piVar1 = (int *)((long)flags + lVar7 + -4);
        *piVar1 = *piVar1 + POPCOUNT((uint)(SUB321(auVar8 >> 7,0) & 1) |
                                     (uint)(SUB321(auVar8 >> 0xf,0) & 1) << 1 |
                                     (uint)(SUB321(auVar8 >> 0x17,0) & 1) << 2 |
                                     (uint)(SUB321(auVar8 >> 0x1f,0) & 1) << 3 |
                                     (uint)(SUB321(auVar8 >> 0x27,0) & 1) << 4 |
                                     (uint)(SUB321(auVar8 >> 0x2f,0) & 1) << 5 |
                                     (uint)(SUB321(auVar8 >> 0x37,0) & 1) << 6 |
                                     (uint)(SUB321(auVar8 >> 0x3f,0) & 1) << 7 |
                                     (uint)(SUB321(auVar8 >> 0x47,0) & 1) << 8 |
                                     (uint)(SUB321(auVar8 >> 0x4f,0) & 1) << 9 |
                                     (uint)(SUB321(auVar8 >> 0x57,0) & 1) << 10 |
                                     (uint)(SUB321(auVar8 >> 0x5f,0) & 1) << 0xb |
                                     (uint)(SUB321(auVar8 >> 0x67,0) & 1) << 0xc |
                                     (uint)(SUB321(auVar8 >> 0x6f,0) & 1) << 0xd |
                                     (uint)(SUB321(auVar8 >> 0x77,0) & 1) << 0xe |
                                     (uint)SUB321(auVar8 >> 0x7f,0) << 0xf |
                                     (uint)(SUB321(auVar8 >> 0x87,0) & 1) << 0x10 |
                                     (uint)(SUB321(auVar8 >> 0x8f,0) & 1) << 0x11 |
                                     (uint)(SUB321(auVar8 >> 0x97,0) & 1) << 0x12 |
                                     (uint)(SUB321(auVar8 >> 0x9f,0) & 1) << 0x13 |
                                     (uint)(SUB321(auVar8 >> 0xa7,0) & 1) << 0x14 |
                                     (uint)(SUB321(auVar8 >> 0xaf,0) & 1) << 0x15 |
                                     (uint)(SUB321(auVar8 >> 0xb7,0) & 1) << 0x16 |
                                     (uint)SUB321(auVar8 >> 0xbf,0) << 0x17 |
                                     (uint)(SUB321(auVar8 >> 199,0) & 1) << 0x18 |
                                     (uint)(SUB321(auVar8 >> 0xcf,0) & 1) << 0x19 |
                                     (uint)(SUB321(auVar8 >> 0xd7,0) & 1) << 0x1a |
                                     (uint)(SUB321(auVar8 >> 0xdf,0) & 1) << 0x1b |
                                     (uint)(SUB321(auVar8 >> 0xe7,0) & 1) << 0x1c |
                                     (uint)(SUB321(auVar8 >> 0xef,0) & 1) << 0x1d |
                                     (uint)(SUB321(auVar8 >> 0xf7,0) & 1) << 0x1e |
                                     (uint)(byte)(auVar8[0x1f] >> 7) << 0x1f);
        piVar1 = (int *)((long)flags + lVar7 + 0x1c);
        *piVar1 = *piVar1 + POPCOUNT((uint)(SUB321(auVar9 >> 7,0) & 1) |
                                     (uint)(SUB321(auVar9 >> 0xf,0) & 1) << 1 |
                                     (uint)(SUB321(auVar9 >> 0x17,0) & 1) << 2 |
                                     (uint)(SUB321(auVar9 >> 0x1f,0) & 1) << 3 |
                                     (uint)(SUB321(auVar9 >> 0x27,0) & 1) << 4 |
                                     (uint)(SUB321(auVar9 >> 0x2f,0) & 1) << 5 |
                                     (uint)(SUB321(auVar9 >> 0x37,0) & 1) << 6 |
                                     (uint)(SUB321(auVar9 >> 0x3f,0) & 1) << 7 |
                                     (uint)(SUB321(auVar9 >> 0x47,0) & 1) << 8 |
                                     (uint)(SUB321(auVar9 >> 0x4f,0) & 1) << 9 |
                                     (uint)(SUB321(auVar9 >> 0x57,0) & 1) << 10 |
                                     (uint)(SUB321(auVar9 >> 0x5f,0) & 1) << 0xb |
                                     (uint)(SUB321(auVar9 >> 0x67,0) & 1) << 0xc |
                                     (uint)(SUB321(auVar9 >> 0x6f,0) & 1) << 0xd |
                                     (uint)(SUB321(auVar9 >> 0x77,0) & 1) << 0xe |
                                     (uint)SUB321(auVar9 >> 0x7f,0) << 0xf |
                                     (uint)(SUB321(auVar9 >> 0x87,0) & 1) << 0x10 |
                                     (uint)(SUB321(auVar9 >> 0x8f,0) & 1) << 0x11 |
                                     (uint)(SUB321(auVar9 >> 0x97,0) & 1) << 0x12 |
                                     (uint)(SUB321(auVar9 >> 0x9f,0) & 1) << 0x13 |
                                     (uint)(SUB321(auVar9 >> 0xa7,0) & 1) << 0x14 |
                                     (uint)(SUB321(auVar9 >> 0xaf,0) & 1) << 0x15 |
                                     (uint)(SUB321(auVar9 >> 0xb7,0) & 1) << 0x16 |
                                     (uint)SUB321(auVar9 >> 0xbf,0) << 0x17 |
                                     (uint)(SUB321(auVar9 >> 199,0) & 1) << 0x18 |
                                     (uint)(SUB321(auVar9 >> 0xcf,0) & 1) << 0x19 |
                                     (uint)(SUB321(auVar9 >> 0xd7,0) & 1) << 0x1a |
                                     (uint)(SUB321(auVar9 >> 0xdf,0) & 1) << 0x1b |
                                     (uint)(SUB321(auVar9 >> 0xe7,0) & 1) << 0x1c |
                                     (uint)(SUB321(auVar9 >> 0xef,0) & 1) << 0x1d |
                                     (uint)(SUB321(auVar9 >> 0xf7,0) & 1) << 0x1e |
                                     (uint)(byte)(auVar9[0x1f] >> 7) << 0x1f);
        auVar8 = vpaddb_avx2(auVar8,auVar8);
        auVar9 = vpaddb_avx2(auVar9,auVar9);
        lVar7 = lVar7 + -4;
      } while (lVar7 != 0);
      uVar5 = uVar6;
      uVar4 = uVar6 + 2;
    } while (uVar6 + 2 <= (ulong)(len >> 4));
    uVar6 = uVar6 << 4;
  }
  if (uVar6 < len) {
    auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar11 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar12 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar13 = vpbroadcastd_avx512f();
      auVar13 = vpsrlvd_avx512f(auVar13,auVar11);
      auVar13 = vpandd_avx512f(auVar13,auVar12);
      auVar10 = vpaddd_avx512f(auVar13,auVar10);
      uVar6 = uVar6 + 1;
    } while (len != uVar6);
    auVar10 = vmovdqu64_avx512f(auVar10);
    *(undefined1 (*) [64])flags = auVar10;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m256i v0 = _mm256_loadu_si256(data_vectors + i + 0);
        __m256i v1 = _mm256_loadu_si256(data_vectors + i + 1);
        __m256i input0 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v1, 8));
        __m256i input1 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v1, 8));
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input0));
            flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input1));
            input0 = _mm256_add_epi8(input0, input0);
            input1 = _mm256_add_epi8(input1, input1);
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
   
    return 0;
}